

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtHashMap.h
# Opt level: O1

int __thiscall
cbtHashMap<cbtHashPtr,_cbtCollisionShape_*>::findIndex
          (cbtHashMap<cbtHashPtr,_cbtCollisionShape_*> *this,cbtHashPtr *key)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  iVar1 = (key->field_0).m_hashValues[1] + (key->field_0).m_hashValues[0];
  uVar2 = ~(iVar1 * 0x8000) + iVar1;
  uVar2 = (uVar2 >> 10 ^ uVar2) * 9;
  uVar2 = uVar2 >> 6 ^ uVar2;
  uVar2 = ~(uVar2 << 0xb) + uVar2;
  uVar3 = (long)(int)(uVar2 >> 0x10 ^ uVar2) & (long)(this->m_valueArray).m_capacity - 1U;
  iVar1 = -1;
  if (((uint)uVar3 < (uint)(this->m_hashTable).m_size) &&
     (iVar1 = (this->m_hashTable).m_data[uVar3], iVar1 != -1)) {
    do {
      if ((key->field_0).m_pointer == (this->m_keyArray).m_data[iVar1].field_0.m_pointer) {
        return iVar1;
      }
      iVar1 = (this->m_next).m_data[iVar1];
    } while (iVar1 != -1);
  }
  return iVar1;
}

Assistant:

SIMD_FORCE_INLINE unsigned int getHash() const
	{
		const bool VOID_IS_8 = ((sizeof(void*) == 8));

		unsigned int key = VOID_IS_8 ? m_hashValues[0] + m_hashValues[1] : m_hashValues[0];
		// Thomas Wang's hash
		key += ~(key << 15);
		key ^= (key >> 10);
		key += (key << 3);
		key ^= (key >> 6);
		key += ~(key << 11);
		key ^= (key >> 16);
		return key;
	}